

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O3

err_t btokCVCWrap(octet *cert,size_t *cert_len,btok_cvc_t *cvc,octet *privkey,size_t privkey_len)

{
  ulong uVar1;
  bool_t bVar2;
  err_t eVar3;
  int iVar4;
  size_t sVar5;
  octet *poVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  octet *poVar10;
  char *oid;
  octet *poVar11;
  size_t sVar12;
  octet *poVar13;
  octet *poVar14;
  octet *local_260;
  der_anchor_t CertHAT [1];
  der_anchor_t PubKey [1];
  der_anchor_t CVCert [1];
  der_anchor_t local_1c8;
  der_anchor_t CVExt [1];
  der_anchor_t CertBody [1];
  
  bVar2 = memIsValid(cvc,0x128);
  if (bVar2 == 0) {
    return 0x6d;
  }
  uVar1 = privkey_len - 0x18 >> 3;
  if (5 < (privkey_len << 0x3d | uVar1)) {
    return 0x6d;
  }
  if ((0x2bUL >> (uVar1 & 0x3f) & 1) == 0) {
    return 0x6d;
  }
  bVar2 = memIsValid(privkey,privkey_len);
  if (bVar2 != 0) {
    if ((cert_len != (size_t *)0x0) && (bVar2 = memIsValid(cert_len,8), bVar2 == 0)) {
      return 0x6d;
    }
    if (cvc->pubkey_len == 0) {
      eVar3 = btokParamsStd((bign_params *)CertBody,privkey_len);
      if (eVar3 != 0) {
        return eVar3;
      }
      poVar6 = cvc->pubkey;
      if (privkey_len == 0x18) {
        eVar3 = bign96PubkeyCalc(poVar6,(bign_params *)CertBody,privkey);
      }
      else {
        eVar3 = bignPubkeyCalc(poVar6,(bign_params *)CertBody,privkey);
      }
      if (eVar3 != 0) {
        return eVar3;
      }
      cvc->pubkey_len = privkey_len * 2;
      memSet(poVar6 + privkey_len * 2,'\0',privkey_len * -2 + 0x80);
    }
    eVar3 = btokCVCCheck(cvc);
    if (eVar3 != 0) {
      return eVar3;
    }
    sVar5 = derTSEQEncStart(CVCert,cert,0,0x7f21);
    poVar6 = cert + sVar5;
    if (cert == (octet *)0x0) {
      poVar6 = (octet *)0x0;
    }
    bVar2 = memIsValid(cvc,0x128);
    sVar12 = 0xffffffffffffffff;
    if ((bVar2 != 0) && (bVar2 = btokCVCNameIsValid(cvc->authority), bVar2 != 0)) {
      bVar2 = btokCVCNameIsValid(cvc->holder);
      if (bVar2 != 0) {
        poVar10 = cvc->from;
        bVar2 = tmDateIsValid2(poVar10);
        if (bVar2 != 0) {
          poVar14 = cvc->until;
          bVar2 = tmDateIsValid2(poVar14);
          if ((((bVar2 != 0) && (iVar4 = memCmp(poVar10,poVar14,6), iVar4 < 1)) &&
              (uVar1 = cvc->pubkey_len - 0x30 >> 4, (cvc->pubkey_len << 0x3c | uVar1) < 6)) &&
             ((0x2bUL >> (uVar1 & 0x3f) & 1) != 0)) {
            sVar12 = derTSEQEncStart(CertBody,poVar6,0,0x7f4e);
            poVar11 = poVar6 + sVar12;
            if (poVar6 == (octet *)0x0) {
              poVar11 = (octet *)0x0;
            }
            sVar7 = derTSIZEEnc(poVar11,0x5f29,0);
            poVar13 = poVar11 + sVar7;
            if (poVar11 == (octet *)0x0) {
              poVar13 = (octet *)0x0;
            }
            sVar8 = derTPSTREnc(poVar13,0x42,cvc->authority);
            poVar11 = poVar13 + sVar8;
            if (poVar13 == (octet *)0x0) {
              poVar11 = (octet *)0x0;
            }
            sVar8 = sVar7 + sVar12 + sVar8;
            sVar12 = derTSEQEncStart(PubKey,poVar11,sVar8,0x7f49);
            poVar13 = poVar11 + sVar12;
            if (poVar11 == (octet *)0x0) {
              poVar13 = (octet *)0x0;
            }
            sVar7 = derOIDEnc(poVar13,"1.2.112.0.2.0.34.101.45.2.1");
            poVar11 = poVar13 + sVar7;
            if (poVar13 == (octet *)0x0) {
              poVar11 = (octet *)0x0;
            }
            sVar9 = derTBITEnc(poVar11,3,cvc->pubkey,cvc->pubkey_len << 3);
            poVar13 = poVar11 + sVar9;
            if (poVar11 == (octet *)0x0) {
              poVar13 = (octet *)0x0;
            }
            sVar9 = sVar8 + sVar12 + sVar7 + sVar9;
            sVar12 = derTSEQEncStop(poVar13,sVar9,PubKey);
            poVar11 = poVar13 + sVar12;
            if (poVar13 == (octet *)0x0) {
              poVar11 = (octet *)0x0;
            }
            sVar7 = derTPSTREnc(poVar11,0x5f20,cvc->holder);
            poVar13 = poVar11 + sVar7;
            if (poVar11 == (octet *)0x0) {
              poVar13 = (octet *)0x0;
            }
            local_260 = (octet *)(sVar9 + sVar12 + sVar7);
            bVar2 = memIsZero(cvc->hat_eid,5);
            if (bVar2 == 0) {
              sVar12 = derTSEQEncStart(CertHAT,poVar13,(size_t)local_260,0x7f4c);
              poVar11 = poVar13 + sVar12;
              if (poVar13 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar7 = derOIDEnc(poVar11,"1.2.112.0.2.0.34.101.79.6.1");
              poVar13 = poVar11 + sVar7;
              if (poVar11 == (octet *)0x0) {
                poVar13 = (octet *)0x0;
              }
              sVar8 = derEnc(poVar13,4,cvc->hat_eid,5);
              poVar11 = poVar13 + sVar8;
              if (poVar13 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar8 = sVar12 + (long)local_260 + sVar7 + sVar8;
              sVar12 = derTSEQEncStop(poVar11,sVar8,CertHAT);
              poVar13 = poVar11 + sVar12;
              if (poVar11 == (octet *)0x0) {
                poVar13 = (octet *)0x0;
              }
              local_260 = (octet *)(sVar8 + sVar12);
            }
            sVar12 = derEnc(poVar13,0x5f25,poVar10,6);
            poVar10 = poVar13 + sVar12;
            if (poVar13 == (octet *)0x0) {
              poVar10 = (octet *)0x0;
            }
            sVar7 = derEnc(poVar10,0x5f24,poVar14,6);
            poVar14 = poVar10 + sVar7;
            if (poVar10 == (octet *)0x0) {
              poVar14 = (octet *)0x0;
            }
            sVar7 = (long)local_260 + sVar12 + sVar7;
            bVar2 = memIsZero(cvc->hat_esign,2);
            if (bVar2 == 0) {
              sVar12 = derTSEQEncStart(CVExt,poVar14,sVar7,0x65);
              poVar10 = poVar14 + sVar12;
              if (poVar14 == (octet *)0x0) {
                poVar10 = (octet *)0x0;
              }
              sVar8 = derTSEQEncStart(&local_1c8,poVar10,sVar12 + sVar7,0x73);
              poVar14 = poVar10 + sVar8;
              if (poVar10 == (octet *)0x0) {
                poVar14 = (octet *)0x0;
              }
              sVar9 = derOIDEnc(poVar14,"1.2.112.0.2.0.34.101.79.8.1");
              poVar10 = poVar14 + sVar9;
              if (poVar14 == (octet *)0x0) {
                poVar10 = (octet *)0x0;
              }
              sVar9 = sVar12 + sVar7 + sVar8 + sVar9;
              sVar12 = derTSEQEncStart(CertHAT,poVar10,sVar9,0x7f4c);
              poVar14 = poVar10 + sVar12;
              if (poVar10 == (octet *)0x0) {
                poVar14 = (octet *)0x0;
              }
              sVar8 = derOIDEnc(poVar14,"1.2.112.0.2.0.34.101.79.6.2");
              poVar10 = poVar14 + sVar8;
              if (poVar14 == (octet *)0x0) {
                poVar10 = (octet *)0x0;
              }
              sVar7 = derEnc(poVar10,4,cvc->hat_esign,2);
              poVar14 = poVar10 + sVar7;
              if (poVar10 == (octet *)0x0) {
                poVar14 = (octet *)0x0;
              }
              sVar7 = sVar9 + sVar12 + sVar8 + sVar7;
              sVar12 = derTSEQEncStop(poVar14,sVar7,CertHAT);
              poVar10 = poVar14 + sVar12;
              if (poVar14 == (octet *)0x0) {
                poVar10 = (octet *)0x0;
              }
              sVar7 = sVar7 + sVar12;
              sVar12 = derTSEQEncStop(poVar10,sVar7,&local_1c8);
              poVar11 = poVar10 + sVar12;
              if (poVar10 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar7 = sVar7 + sVar12;
              sVar12 = derTSEQEncStop(poVar11,sVar7,CVExt);
              poVar14 = poVar11 + sVar12;
              if (poVar11 == (octet *)0x0) {
                poVar14 = (octet *)0x0;
              }
              sVar7 = sVar7 + sVar12;
            }
            sVar12 = derTSEQEncStop(poVar14,sVar7,CertBody);
            sVar12 = sVar12 + sVar7;
          }
        }
      }
    }
    if (poVar6 != (octet *)0x0) {
      CertHAT[0].der = (octet *)0x10;
      eVar3 = btokParamsStd((bign_params *)CertBody,privkey_len);
      if (eVar3 != 0) {
        return eVar3;
      }
      if (privkey_len < 0x21) {
        sVar7 = beltHash_keep();
        poVar10 = (octet *)blobCreate(privkey_len * 2 + sVar7);
        if (poVar10 == (octet *)0x0) {
          return 0x6e;
        }
        local_260 = poVar10 + privkey_len;
        poVar14 = local_260 + privkey_len;
        beltHashStart(poVar14);
        beltHashStepH(poVar6,sVar12,poVar14);
        beltHashStepG2(poVar10,privkey_len,poVar14);
        oid = "1.2.112.0.2.0.34.101.31.81";
      }
      else {
        sVar7 = bashHash_keep();
        poVar10 = (octet *)blobCreate(privkey_len * 2 + sVar7);
        if (poVar10 == (octet *)0x0) {
          return 0x6e;
        }
        local_260 = poVar10 + privkey_len;
        poVar14 = local_260 + privkey_len;
        bashHashStart(poVar14,privkey_len * 4);
        bashHashStepH(poVar6,sVar12,poVar14);
        bashHashStepG(poVar10,privkey_len,poVar14);
        oid = "1.2.112.0.2.0.34.101.77.13";
        if (privkey_len == 0x30) {
          oid = "1.2.112.0.2.0.34.101.77.12";
        }
      }
      eVar3 = bignOidToDER((octet *)PubKey,(size_t *)CertHAT,oid);
      if (eVar3 != 0) {
        blobClose(poVar14);
        return eVar3;
      }
      bVar2 = rngIsValid();
      sVar7 = 0;
      if (bVar2 != 0) {
        rngStepR(local_260,privkey_len,(void *)0x0);
        sVar7 = privkey_len;
      }
      if (privkey_len == 0x18) {
        eVar3 = bign96Sign2(cvc->sig,(bign_params *)CertBody,(octet *)PubKey,(size_t)CertHAT[0].der,
                            poVar10,privkey,local_260,sVar7);
      }
      else {
        eVar3 = bignSign2(cvc->sig,(bign_params *)CertBody,(octet *)PubKey,(size_t)CertHAT[0].der,
                          poVar10,privkey,local_260,sVar7);
      }
      blobClose(poVar10);
      if (eVar3 != 0) {
        return eVar3;
      }
    }
    poVar10 = poVar6 + sVar12;
    if (poVar6 == (octet *)0x0) {
      poVar10 = (octet *)0x0;
    }
    sVar7 = 0x22;
    if (privkey_len != 0x18) {
      sVar7 = (privkey_len >> 1) + privkey_len;
    }
    cvc->sig_len = sVar7;
    sVar7 = derEnc(poVar10,0x5f37,cvc->sig,sVar7);
    poVar6 = poVar10 + sVar7;
    if (poVar10 == (octet *)0x0) {
      poVar6 = (octet *)0x0;
    }
    sVar7 = sVar5 + sVar12 + sVar7;
    sVar5 = derTSEQEncStop(poVar6,sVar7,CVCert);
    if (cert_len != (size_t *)0x0) {
      *cert_len = sVar7 + sVar5;
    }
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t btokCVCWrap(octet cert[], size_t* cert_len, btok_cvc_t* cvc,
	const octet privkey[], size_t privkey_len)
{
	err_t code;
	der_anchor_t CVCert[1];
	size_t count = 0;
	size_t t;
	// проверить входные данные
	if (!memIsValid(cvc, sizeof(btok_cvc_t)) ||
		privkey_len != 24 && 
			privkey_len != 32 && privkey_len != 48 && privkey_len != 64 ||
		!memIsValid(privkey, privkey_len) ||
		!memIsNullOrValid(cert_len, O_PER_S))
		return ERR_BAD_INPUT;
	// построить открытый ключ
	if (cvc->pubkey_len == 0)
	{
		code = btokPubkeyCalc(cvc->pubkey, privkey, privkey_len);
		ERR_CALL_CHECK(code);
		cvc->pubkey_len = 2 * privkey_len;
		memSetZero(cvc->pubkey + cvc->pubkey_len,
			sizeof(cvc->pubkey) - cvc->pubkey_len);
	}
	// проверить содержимое сертификата
	code = btokCVCCheck(cvc);
	ERR_CALL_CHECK(code);
	// начать кодирование...
	t = derTSEQEncStart(CVCert, cert, count, 0x7F21);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// ...кодировать и подписать основную часть...
	t = btokCVCBodyEnc(cert, cvc);
	ASSERT(t != SIZE_MAX);
	if (cert)
	{
		code = btokSign(cvc->sig, cert, t, privkey, privkey_len);
		ERR_CALL_CHECK(code);
	}
	cert = cert ? cert + t : 0, count += t;
	if (privkey_len == 24)
		cvc->sig_len = 34;
	else
		cvc->sig_len = privkey_len + privkey_len / 2;
	// ...кодировать подпись...
	t = derTOCTEnc(cert, 0x5F37, cvc->sig, cvc->sig_len);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// ...завершить кодирование
	t = derTSEQEncStop(cert, count, CVCert);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// возвратить длину DER-кода
	if (cert_len)
		*cert_len = count;
	return ERR_OK;
}